

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int pushglobalfuncname(lua_State *L,lua_Debug *ar)

{
  int idx;
  int iVar1;
  char *__s1;
  char *name;
  int top;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  idx = lua_gettop(L);
  lua_getinfo(L,"f",ar);
  lua_getfield(L,-0xf4628,"_LOADED");
  iVar1 = findfield(L,idx + 1,2);
  if (iVar1 == 0) {
    lua_settop(L,idx);
    L_local._4_4_ = 0;
  }
  else {
    __s1 = lua_tolstring(L,-1,(size_t *)0x0);
    iVar1 = strncmp(__s1,"_G.",3);
    if (iVar1 == 0) {
      lua_pushstring(L,__s1 + 3);
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
    }
    lua_copy(L,-1,idx + 1);
    lua_settop(L,-3);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int pushglobalfuncname (lua_State *L, lua_Debug *ar) {
  int top = lua_gettop(L);
  lua_getinfo(L, "f", ar);  /* push function */
  lua_getfield(L, LUA_REGISTRYINDEX, LUA_LOADED_TABLE);
  if (findfield(L, top + 1, 2)) {
    const char *name = lua_tostring(L, -1);
    if (strncmp(name, LUA_GNAME ".", 3) == 0) {  /* name start with '_G.'? */
      lua_pushstring(L, name + 3);  /* push name without prefix */
      lua_remove(L, -2);  /* remove original name */
    }
    lua_copy(L, -1, top + 1);  /* move name to proper place */
    lua_pop(L, 2);  /* remove pushed values */
    return 1;
  }
  else {
    lua_settop(L, top);  /* remove function and global table */
    return 0;
  }
}